

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
  *__num;
  _Rb_tree_header *p_Var1;
  pointer constraint_elements;
  bound_factor *pbVar2;
  uint uVar3;
  pointer pmVar4;
  pointer pmVar5;
  subsolver_type *psVar6;
  pointer pmVar7;
  pointer pfVar8;
  subsolver_type sVar9;
  int bk_min;
  long lVar10;
  int bk_max;
  int iVar11;
  bound_factor *pbVar12;
  pointer pfVar13;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong max_variables;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  size_t local_90;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  std::make_unique<double[]>((size_t)&this->P);
  std::make_unique<int[]>((size_t)&this->A);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::subsolver_type[]>
            ((size_t)&this->Z);
  __num = &this->b;
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::bound_factor[]>
            ((size_t)__num);
  std::make_unique<double[]>((size_t)&this->pi);
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  auVar19 = ZEXT432(0) << 0x40;
  (this->bb).items =
       (vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
        )auVar19._0_24_;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar19._24_8_;
  *(undefined1 (*) [32])
   &(this->bb).items.
    super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::item>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar19;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  auVar20 = ZEXT464(0) << 0x40;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_double>::item>_>
        )auVar20._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar20._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar20._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar20._56_8_;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar4 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pmVar5 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  max_variables = 0;
  lVar10 = 0;
  local_90 = 0;
  uVar18 = 0;
  do {
    if (uVar18 == (((long)pmVar4 - (long)pmVar5) / 0x28 & 0xffffffffU)) {
      if (local_90 != 0) {
        exhaustive_solver<baryonyx::itm::minimize_tag,_double>::reserve
                  (&this->ex,max_variables,local_90);
      }
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::reserve(&this->bb,max_variables)
      ;
      return;
    }
    lVar17 = 0;
    iVar11 = 0;
    psVar6 = (this->Z)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::subsolver_type[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::subsolver_type[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::subsolver_type_*,_false>
             ._M_head_impl;
    psVar6[uVar18] = linear;
    pmVar7 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    constraint_elements = pmVar7 + uVar18;
    pfVar8 = *(pointer *)
              ((long)&pmVar7[uVar18].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    bk_max = 0;
    piVar14 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)lVar10;
    sVar9 = linear;
    for (pfVar13 = *(pointer *)
                    &pmVar7[uVar18].elements.
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl; pfVar13 != pfVar8; pfVar13 = pfVar13 + 1) {
      if (pfVar13->factor == 0) {
        details::fail_fast("Postcondition","cst.factor",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                           ,"135");
      }
      *piVar14 = pfVar13->factor;
      uVar3 = pfVar13->factor;
      uVar16 = 0;
      if ((int)uVar3 < 0) {
        uVar16 = uVar3;
      }
      if (uVar3 - 2 < 0xfffffffd) {
        sVar9 = branch_and_bound;
        psVar6[uVar18] = branch_and_bound;
      }
      iVar11 = iVar11 + uVar16;
      lVar17 = lVar17 + -1;
      piVar14 = piVar14 + 1;
      bk_max = bk_max + (~((int)uVar3 >> 0x1f) & uVar3);
    }
    uVar15 = -lVar17;
    if ((sVar9 == branch_and_bound) && (uVar15 < 10)) {
      sVar9 = exhaustive;
      psVar6[uVar18] = exhaustive;
    }
    bk_min = constraint_elements->min;
    if (bk_min == constraint_elements->max) {
      pbVar12 = (__num->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
                ._M_head_impl;
      pbVar12[uVar18].min = bk_min;
      bk_max = bk_min;
    }
    else {
      if ((bk_min <= iVar11) || (bk_max <= constraint_elements->max)) {
        if (sVar9 == branch_and_bound) {
          sVar9 = unconstrained_branch_and_bound;
        }
        else {
          if (sVar9 != exhaustive) goto LAB_004e0779;
          sVar9 = unconstrained_exhaustive;
        }
        psVar6[uVar18] = sVar9;
      }
LAB_004e0779:
      if (bk_min < iVar11) {
        bk_min = iVar11;
      }
      pbVar12 = (__num->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
                ._M_head_impl;
      pbVar12[uVar18].min = bk_min;
      if (constraint_elements->max < bk_max) {
        bk_max = constraint_elements->max;
      }
    }
    if (max_variables <= uVar15) {
      max_variables = uVar15;
    }
    pbVar12[uVar18].max = bk_max;
    if ((sVar9 | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
      exhaustive_solver<baryonyx::itm::minimize_tag,double>::
      build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                ((exhaustive_solver<baryonyx::itm::minimize_tag,double> *)&this->ex,(int)uVar18,
                 &constraint_elements->elements,bk_min,bk_max);
      local_90 = local_90 + 1;
      pbVar12 = (__num->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
                ._M_head_impl;
    }
    lVar10 = (int)lVar10 - lVar17;
    pbVar2 = pbVar12 + uVar18;
    pbVar12 = pbVar12 + uVar18;
    uVar18 = uVar18 + 1;
    if (pbVar12->max < pbVar2->min) {
      details::fail_fast("Postcondition","b[i].min <= b[i].max",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                         ,"182");
    }
  } while( true );
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }